

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O1

void __thiscall luna::Library::RegisterNumber(Library *this,Table *table,char *name,double number)

{
  anon_union_8_9_8deb4486_for_Value_0 local_30;
  undefined4 local_28;
  anon_union_8_9_8deb4486_for_Value_0 local_20;
  undefined4 local_18;
  
  local_20.obj_ = (GCObject *)0x0;
  local_18 = 4;
  local_20.str_ = State::GetString(this->state_,name);
  local_28 = 2;
  local_30.num_ = number;
  Table::SetValue(table,(Value *)&local_20,(Value *)&local_30);
  return;
}

Assistant:

void Library::RegisterNumber(Table *table, const char *name, double number)
    {
        Value k;
        k.type_ = ValueT_String;
        k.str_ = state_->GetString(name);

        Value v;
        v.type_ = ValueT_Number;
        v.num_ = number;
        table->SetValue(k, v);
    }